

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O0

bool duckdb::SupportsOtherBucket(LogicalType *type)

{
  LogicalTypeId LVar1;
  ulong uVar2;
  LogicalType *in_RDI;
  bool local_1;
  
  uVar2 = duckdb::LogicalType::HasAlias();
  if ((uVar2 & 1) == 0) {
    LVar1 = LogicalType::id(in_RDI);
    switch(LVar1) {
    case TINYINT:
    case SMALLINT:
    case INTEGER:
    case BIGINT:
    case DATE:
    case TIME:
    case TIMESTAMP_SEC:
    case TIMESTAMP_MS:
    case TIMESTAMP:
    case TIMESTAMP_NS:
    case DECIMAL:
    case FLOAT:
    case DOUBLE:
    case VARCHAR:
    case BLOB:
    case UTINYINT:
    case USMALLINT:
    case UINTEGER:
    case UBIGINT:
    case TIMESTAMP_TZ:
    case TIME_TZ:
    case UHUGEINT:
    case HUGEINT:
    case STRUCT:
    case LIST:
      local_1 = true;
      break;
    default:
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool SupportsOtherBucket(const LogicalType &type) {
	if (type.HasAlias()) {
		return false;
	}
	switch (type.id()) {
	case LogicalTypeId::TINYINT:
	case LogicalTypeId::SMALLINT:
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::BIGINT:
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::FLOAT:
	case LogicalTypeId::DOUBLE:
	case LogicalTypeId::DECIMAL:
	case LogicalTypeId::UTINYINT:
	case LogicalTypeId::USMALLINT:
	case LogicalTypeId::UINTEGER:
	case LogicalTypeId::UBIGINT:
	case LogicalTypeId::UHUGEINT:
	case LogicalTypeId::TIME:
	case LogicalTypeId::TIME_TZ:
	case LogicalTypeId::DATE:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
	case LogicalTypeId::TIMESTAMP_SEC:
	case LogicalTypeId::TIMESTAMP_MS:
	case LogicalTypeId::TIMESTAMP_NS:
	case LogicalTypeId::VARCHAR:
	case LogicalTypeId::BLOB:
	case LogicalTypeId::STRUCT:
	case LogicalTypeId::LIST:
		return true;
	default:
		return false;
	}
}